

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void Curl_cwriter_remove_by_name(Curl_easy *data,char *name)

{
  Curl_cwtype *writer;
  int iVar1;
  Curl_cwriter *w;
  Curl_cwriter **anchor;
  char *name_local;
  Curl_easy *data_local;
  
  w = (Curl_cwriter *)&(data->req).writer_stack;
  while (w->cwt != (Curl_cwtype *)0x0) {
    iVar1 = strcmp(name,*(char **)w->cwt->name);
    if (iVar1 == 0) {
      writer = w->cwt;
      w->cwt = (Curl_cwtype *)writer->alias;
      Curl_cwriter_free(data,(Curl_cwriter *)writer);
    }
    else {
      w = (Curl_cwriter *)&w->cwt->alias;
    }
  }
  return;
}

Assistant:

void Curl_cwriter_remove_by_name(struct Curl_easy *data,
                                 const char *name)
{
  struct Curl_cwriter **anchor = &data->req.writer_stack;

  while(*anchor) {
    if(!strcmp(name, (*anchor)->cwt->name)) {
      struct Curl_cwriter *w = (*anchor);
      *anchor = w->next;
      Curl_cwriter_free(data, w);
      continue;
    }
    anchor = &((*anchor)->next);
  }
}